

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.h
# Opt level: O0

void __thiscall Liby::udp_io_task::~udp_io_task(udp_io_task *this)

{
  udp_io_task *this_local;
  
  std::unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>::
  ~unique_ptr(&this->handler_);
  std::shared_ptr<Liby::Buffer>::~shared_ptr(&this->buffer_);
  return;
}

Assistant:

udp_io_task() = default;